

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O2

void TestEof<long>(void)

{
  istream *piVar1;
  unit_test_log_t *puVar2;
  int iVar3;
  bool bVar4;
  ulong local_2f0;
  char c;
  unit_test_log_t local_2e0;
  undefined1 local_2d8;
  undefined8 *local_2d0;
  char *local_2c8;
  long d;
  OutputBuffer buf1;
  OutputBuffer buf2;
  vector<char,_std::allocator<char>_> eofs;
  char *local_280;
  char *local_278;
  const_string local_270;
  const_string local_260;
  char *local_250;
  char *local_248;
  const_string local_240;
  const_string local_230;
  char *local_220;
  char *local_218;
  const_string local_210;
  const_string local_200;
  char *local_1f0;
  char *local_1e8;
  const_string local_1e0;
  const_string local_1d0;
  istream is;
  
  is.super_istream._vptr_basic_istream._0_1_ = 0xff;
  std::vector<char,_std::allocator<char>_>::vector
            (&eofs,0xc,(value_type *)&is,(allocator_type *)&local_2e0);
  avro::OutputBuffer::OutputBuffer(&buf1,0);
  avro::detail::BufferImpl::writeTo
            (buf1.pimpl_.px,
             eofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,(long)eofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)eofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
  avro::OutputBuffer::OutputBuffer(&buf2,0);
  avro::detail::BufferImpl::writeTo
            (buf2.pimpl_.px,
             eofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,(long)eofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)eofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
  avro::OutputBuffer::append<avro::OutputBuffer>(&buf1,&buf2);
  avro::istream::istream(&is,&buf1);
  iVar3 = 3;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    piVar1 = &is;
    std::istream::read((char *)piVar1,(long)&d);
    local_230.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
    ;
    local_230.m_end = "";
    local_240.m_begin = "";
    local_240.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)piVar1,&local_230,0x1bf,&local_240);
    local_2d8 = 0;
    local_2e0.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001ea848;
    local_2d0 = &boost::unit_test::lazy_ostream::inst;
    local_2c8 = "";
    local_250 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
    ;
    local_248 = "";
    local_2f0 = is.super_istream._M_gcount;
    _c = 8;
    puVar2 = &local_2e0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (puVar2,&local_250,0x1bf,1,2,&local_2f0,"is.gcount()",&c,
               "static_cast<std::streamsize>(sizeof(T))");
    local_260.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
    ;
    local_260.m_end = "";
    local_270.m_begin = "";
    local_270.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,&local_260,0x1c0,&local_270);
    local_2d8 = 0;
    local_2e0.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001ea848;
    local_2d0 = &boost::unit_test::lazy_ostream::inst;
    local_2c8 = "";
    local_280 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
    ;
    local_278 = "";
    local_2f0 = CONCAT71(local_2f0._1_7_,
                         (byte)(&is.super_istream.field_0x20)
                               [*(long *)(CONCAT71(is.super_istream._vptr_basic_istream._1_7_,
                                                   is.super_istream._vptr_basic_istream._0_1_) +
                                         -0x18)] >> 1) & 0xffffffffffffff01;
    _c = _c & 0xffffffffffffff00;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_2e0,&local_280,0x1c0,1,2,&local_2f0,"is.eof()",&c,"false");
  }
  piVar1 = &is;
  std::istream::read((char *)piVar1,(long)&c);
  local_1d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1d0.m_end = "";
  local_1e0.m_begin = "";
  local_1e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)piVar1,&local_1d0,0x1c5,&local_1e0);
  puVar2 = &local_2e0;
  local_2d8 = 0;
  local_2e0.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001ea848;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = "";
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1e8 = "";
  d = is.super_istream._M_gcount;
  local_2f0 = local_2f0 & 0xffffffff00000000;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (puVar2,&local_1f0,0x1c5,1,2,&d,"is.gcount()",&local_2f0,"0");
  local_200.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_200.m_end = "";
  local_210.m_begin = "";
  local_210.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,&local_200,0x1c6,&local_210);
  local_2d8 = 0;
  local_2e0.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001ea848;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = "";
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_218 = "";
  d = CONCAT71(d._1_7_,(byte)(&is.super_istream.field_0x20)
                             [*(long *)(CONCAT71(is.super_istream._vptr_basic_istream._1_7_,
                                                 is.super_istream._vptr_basic_istream._0_1_) + -0x18
                                       )] >> 1) & 0xffffffffffffff01;
  local_2f0 = CONCAT71(local_2f0._1_7_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_2e0,&local_220,0x1c6,1,2,&d,"is.eof()",&local_2f0,"true");
  avro::istream::~istream(&is);
  boost::detail::shared_count::~shared_count(&buf2.pimpl_.pn);
  boost::detail::shared_count::~shared_count(&buf1.pimpl_.pn);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&eofs.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void TestEof()
{
    // create a message full of eof chars
    std::vector<char> eofs(sizeof(T) * 3 / 2, -1);

    OutputBuffer buf1;
    buf1.writeTo(&eofs[0], eofs.size());

    OutputBuffer buf2;
    buf2.writeTo(&eofs[0], eofs.size());

    // append the buffers, so the first 
    // character on a buffer boundary is eof
    buf1.append(buf2);

    avro::istream is(buf1);

    for(int i = 0; i < 3; ++i) {
        T d;
        char *addr = reinterpret_cast<char *>(&d);
        is.read(addr, sizeof(T));
        BOOST_CHECK_EQUAL(is.gcount(), static_cast<std::streamsize>(sizeof(T)));
        BOOST_CHECK_EQUAL(is.eof(), false);
    }

    char c;
    is.read(&c, sizeof(c));
    BOOST_CHECK_EQUAL(is.gcount(), 0);
    BOOST_CHECK_EQUAL(is.eof(), true);
}